

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesInteractionType.hpp
# Opt level: O3

void __thiscall
OpenMD::LennardJonesInteractionType::LennardJonesInteractionType
          (LennardJonesInteractionType *this,RealType mySigma,RealType myEpsilon)

{
  NonBondedInteractionType::NonBondedInteractionType(&this->super_NonBondedInteractionType);
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__NonBondedInteractionType_002f53d8;
  NonBondedInteractionType::setLennardJones(&this->super_NonBondedInteractionType);
  this->sigma = mySigma;
  this->epsilon = myEpsilon;
  return;
}

Assistant:

LennardJonesInteractionType(RealType mySigma, RealType myEpsilon) {
      setLennardJones();
      sigma   = mySigma;
      epsilon = myEpsilon;
    }